

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O3

Vec_Ptr_t * Vec_PtrStart(int nSize)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void **__s;
  
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  iVar1 = 8;
  if (6 < nSize - 1U) {
    iVar1 = nSize;
  }
  pVVar2->nCap = iVar1;
  if (iVar1 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)iVar1 << 3);
  }
  pVVar2->pArray = __s;
  pVVar2->nSize = nSize;
  memset(__s,0,(long)nSize << 3);
  return pVVar2;
}

Assistant:

static inline Vec_Ptr_t * Vec_PtrStart( int nSize )
{
    Vec_Ptr_t * p;
    p = Vec_PtrAlloc( nSize );
    p->nSize = nSize;
    memset( p->pArray, 0, sizeof(void *) * (size_t)nSize );
    return p;
}